

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnIfExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  Expr *pEVar2;
  _Head_base<0UL,_wabt::Expr_*,_false> local_30;
  
  pEVar2 = (Expr *)operator_new(0x150);
  (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar2->loc).filename._M_len = 0;
  (pEVar2->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(pEVar2->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar2->loc).field_1.field_1.offset + 4) = 0;
  pEVar2->type_ = If;
  pEVar2->_vptr_Expr = (_func_int **)&PTR__IfExpr_001a1fc0;
  pEVar2[1]._vptr_Expr = (_func_int **)&pEVar2[1].super_intrusive_list_base<wabt::Expr>.prev_;
  pEVar2[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined1 *)&pEVar2[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  *(undefined1 *)&pEVar2[1].loc.filename._M_str = 0;
  Var::Var((Var *)&pEVar2[1].loc.field_1.field_0);
  *(undefined4 *)&pEVar2[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  pEVar2[4]._vptr_Expr = (_func_int **)0x0;
  pEVar2[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar2[3].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar2[3].type_ = 0;
  pEVar2[3].loc.filename._M_str = (char *)0x0;
  pEVar2[3].loc.field_1.field_1.offset = 0;
  pEVar2[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  pEVar2[3].loc.filename._M_len = 0;
  pEVar2[3]._vptr_Expr = (_func_int **)0x0;
  pEVar2[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar2[2].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar2[2].type_ = 0;
  pEVar2[4].loc.filename._M_len = 0;
  pEVar2[4].loc.filename._M_str = (char *)0x0;
  pEVar2[4].loc.field_1.field_1.offset = 0;
  *(undefined8 *)((long)&pEVar2[4].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar2[4].type_ = 0;
  pEVar2[5]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&pEVar2[5].super_intrusive_list_base<wabt::Expr>.next_ = 0;
  SetBlockDeclaration(this,(BlockDeclaration *)&pEVar2[1].loc.filename._M_str,sig_type);
  local_30._M_head_impl = pEVar2;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_30);
  if (local_30._M_head_impl != (Expr *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = PushLabel(this,If,(ExprList *)&pEVar2[3].loc.filename._M_str,(Expr *)0x0);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnIfExpr(Type sig_type) {
  auto expr = std::make_unique<IfExpr>();
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  return PushLabel(LabelType::If, expr_list);
}